

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# loc_comp_tests.cc
# Opt level: O3

void __thiscall
lf::fe::test::lf_fe_DiffusionElementMatrixProviderTensorCoeff_Test::
~lf_fe_DiffusionElementMatrixProviderTensorCoeff_Test
          (lf_fe_DiffusionElementMatrixProviderTensorCoeff_Test *this)

{
  testing::Test::~Test(&this->super_Test);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(lf_fe, DiffusionElementMatrixProviderTensorCoeff) {
  // get a mesh of affine elements so that the element matrices can be
  // calculated exactly.
  auto mesh = lf::mesh::test_utils::GenerateHybrid2DTestMesh(5);
  //// Generate a variable order hierarchic fe space:
  auto fe_space = std::make_shared<HierarchicScalarFESpace<double>>(
      mesh, [&](const mesh::Entity &e) { return (mesh->Index(e)) % 2 + 1; });

  auto max_degree = 2;

  auto alpha2 = mesh::utils::MeshFunctionGlobal([](const Eigen::Vector2d &x) {
    return (Eigen::Matrix2d() << 1, x.x(), x.y(), 2).finished();
  });
  DiffusionElementMatrixProvider emp2(fe_space, alpha2);
  auto evaluator2 = [&](const Eigen::VectorXd &test_coeff,
                        const Eigen::VectorXd &trial_coeff) {
    auto mf_grad_test = MeshFunctionGradFE(fe_space, test_coeff);
    auto mf_grad_trial = MeshFunctionGradFE(fe_space, trial_coeff);
    return lf::fe::IntegrateMeshFunction(
        *mesh, transpose(mf_grad_test) * (alpha2 * mf_grad_trial),
        2 * (max_degree))(0);
  };
  CheckElementMatrixProvider(*fe_space, *fe_space, emp2, evaluator2);
}